

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::SymDecryptInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Session *this_00;
  Token *pTVar5;
  long *plVar6;
  ulong uVar7;
  CK_STATE sessionState;
  CK_RV CVar8;
  long lVar9;
  uchar *puVar10;
  CryptoFactory *pCVar11;
  undefined4 extraout_var;
  long *plVar12;
  size_t sVar13;
  long *in_RDX;
  long in_RDI;
  SymmetricKey *secretkey;
  SymmetricAlgorithm *cipher;
  size_t tagBytes;
  ByteString aad;
  size_t counterBits;
  size_t bb;
  ByteString iv;
  bool padding;
  Type mode;
  Type algo;
  CK_KEY_TYPE keyType;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *key;
  Token *token;
  Session *session;
  Session *in_stack_fffffffffffffe48;
  SymmetricAlgorithm *inSymmetricCryptoOp;
  ByteString *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  SymmetricKey *in_stack_fffffffffffffe60;
  CK_OBJECT_HANDLE in_stack_fffffffffffffe90;
  HandleManager *in_stack_fffffffffffffe98;
  OSObject *in_stack_fffffffffffffee0;
  Token *in_stack_fffffffffffffee8;
  SymmetricKey *in_stack_fffffffffffffef0;
  SoftHSM *this_01;
  Session *local_e0;
  SymmetricAlgorithm local_c8;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar15;
  SoftHSM *in_stack_ffffffffffffffa8;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    return 400;
  }
  if (in_RDX == (long *)0x0) {
    return 7;
  }
  this_00 = (Session *)
            HandleManager::getSession(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  pTVar5 = Session::getToken(this_00);
  if (pTVar5 == (Token *)0x0) {
    return 5;
  }
  iVar4 = Session::getOpType(this_00);
  if (iVar4 != 0) {
    return 0x90;
  }
  plVar6 = (long *)HandleManager::getObject(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if ((plVar6 == (long *)0x0) || (uVar7 = (**(code **)(*plVar6 + 0x50))(), (uVar7 & 1) == 0)) {
    return 0x82;
  }
  bVar1 = (**(code **)(*plVar6 + 0x20))(plVar6,1,0);
  bVar2 = (**(code **)(*plVar6 + 0x20))(plVar6,2,1);
  sessionState = Session::getState(in_stack_fffffffffffffe48);
  CVar8 = haveRead(sessionState,bVar1 & 1,bVar2 & 1);
  if (CVar8 != 0) {
    if (CVar8 != 0x101) {
      return CVar8;
    }
    softHSMLog(6,"SymDecryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xb5e,"User is not authorized");
    return 0x101;
  }
  uVar7 = (**(code **)(*plVar6 + 0x20))(plVar6,0x105,0);
  if ((uVar7 & 1) == 0) {
    return 0x68;
  }
  bVar3 = isMechanismPermitted
                    (in_stack_ffffffffffffffa8,
                     (OSObject *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (CK_MECHANISM_PTR)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                    );
  if (!bVar3) {
    return 0x70;
  }
  lVar9 = (**(code **)(*plVar6 + 0x28))(plVar6,0x100,0x80000000);
  bVar1 = 0;
  ByteString::ByteString((ByteString *)0x1691b6);
  local_c8.currentBufferSize = 8;
  local_c8._40_8_ = 0;
  ByteString::ByteString((ByteString *)0x1691db);
  local_e0 = (Session *)0x0;
  this_01 = (SoftHSM *)*in_RDX;
  if (this_01 == (SoftHSM *)0x121) {
    if (lVar9 != 0x13) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 2;
    uVar14 = 4;
    local_c8.currentBufferSize = 7;
  }
  else if (this_01 == (SoftHSM *)0x122) {
    if (lVar9 != 0x13) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 2;
    uVar14 = 1;
    if ((in_RDX[1] == 0) || (in_RDX[2] == 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xb89,"CBC mode requires an init vector");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffef0 =
         (SymmetricKey *)
         ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(in_stack_fffffffffffffef0,(void *)in_RDX[1],in_RDX[2]);
    local_c8.currentBufferSize = 7;
  }
  else if (this_01 == (SoftHSM *)0x125) {
    if (lVar9 != 0x13) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 2;
    uVar14 = 1;
    bVar1 = 1;
    if ((in_RDX[1] == 0) || (in_RDX[2] == 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xb99,"CBC mode requires an init vector");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffee8 =
         (Token *)ByteString::operator[]
                            (in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(in_stack_fffffffffffffee8,(void *)in_RDX[1],in_RDX[2]);
    local_c8.currentBufferSize = 7;
  }
  else if (this_01 == (SoftHSM *)0x132) {
    if ((lVar9 != 0x14) && (lVar9 != 0x15)) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 3;
    uVar14 = 4;
    local_c8.currentBufferSize = 7;
  }
  else if (this_01 == (SoftHSM *)0x133) {
    if ((lVar9 != 0x14) && (lVar9 != 0x15)) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 3;
    uVar14 = 1;
    if ((in_RDX[1] == 0) || (in_RDX[2] == 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xbb0,"CBC mode requires an init vector");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffee0 =
         (OSObject *)
         ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(in_stack_fffffffffffffee0,(void *)in_RDX[1],in_RDX[2]);
    local_c8.currentBufferSize = 7;
  }
  else if (this_01 == (SoftHSM *)0x136) {
    if ((lVar9 != 0x14) && (lVar9 != 0x15)) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 3;
    uVar14 = 1;
    bVar1 = 1;
    if ((in_RDX[1] == 0) || (in_RDX[2] == 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xbc0,"CBC mode requires an init vector");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    puVar10 = ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(puVar10,(void *)in_RDX[1],in_RDX[2]);
    local_c8.currentBufferSize = 7;
  }
  else if (this_01 == (SoftHSM *)0x1081) {
    if (lVar9 != 0x1f) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 1;
    uVar14 = 4;
  }
  else if (this_01 == (SoftHSM *)0x1082) {
    if (lVar9 != 0x1f) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 1;
    uVar14 = 1;
    if ((in_RDX[1] == 0) || (in_RDX[2] == 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xbd5,"CBC mode requires an init vector");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    puVar10 = ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(puVar10,(void *)in_RDX[1],in_RDX[2]);
  }
  else if (this_01 == (SoftHSM *)0x1085) {
    if (lVar9 != 0x1f) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 1;
    uVar14 = 1;
    bVar1 = 1;
    if ((in_RDX[1] == 0) || (in_RDX[2] == 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xbe4,"CBC mode requires an init vector");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    puVar10 = ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(puVar10,(void *)in_RDX[1],in_RDX[2]);
  }
  else if (this_01 == (SoftHSM *)0x1086) {
    if (lVar9 != 0x1f) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 1;
    uVar14 = 3;
    if ((in_RDX[1] == 0) || (in_RDX[2] != 0x18)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xbf2,"CTR mode requires a counter block");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    local_c8._40_8_ = *(ulong *)in_RDX[1];
    if ((local_c8._40_8_ == 0) || (0x80 < (ulong)local_c8._40_8_)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xbf8,"Invalid ulCounterBits");
      local_8 = 0x71;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    puVar10 = ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    lVar9 = in_RDX[1];
    *(undefined8 *)puVar10 = *(undefined8 *)(lVar9 + 8);
    *(undefined8 *)(puVar10 + 8) = *(undefined8 *)(lVar9 + 0x10);
  }
  else {
    if (this_01 != (SoftHSM *)0x1087) {
      local_8 = 0x70;
      goto LAB_0016a0a5;
    }
    if (lVar9 != 0x1f) {
      local_8 = 99;
      goto LAB_0016a0a5;
    }
    uVar15 = 1;
    uVar14 = 5;
    if ((in_RDX[1] == 0) || (in_RDX[2] != 0x30)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xc06,"GCM mode requires parameters");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    puVar10 = ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    memcpy(puVar10,*(void **)in_RDX[1],((undefined8 *)in_RDX[1])[1]);
    ByteString::resize(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    if (*(long *)(in_RDX[1] + 0x20) != 0) {
      puVar10 = ByteString::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      memcpy(puVar10,*(void **)(in_RDX[1] + 0x18),*(size_t *)(in_RDX[1] + 0x20));
    }
    uVar7 = *(ulong *)(in_RDX[1] + 0x28);
    if ((0x80 < uVar7) || ((uVar7 & 7) != 0)) {
      softHSMLog(7,"SymDecryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xc11,"Invalid ulTagBits value");
      local_8 = 7;
      goto LAB_0016a0a5;
    }
    local_e0 = (Session *)(uVar7 >> 3);
  }
  pCVar11 = CryptoFactory::i();
  iVar4 = (**pCVar11->_vptr_CryptoFactory)(pCVar11,(ulong)uVar15);
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar6 == (long *)0x0) {
    local_8 = 0x70;
  }
  else {
    plVar12 = (long *)operator_new(0x38);
    SymmetricKey::SymmetricKey(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    CVar8 = getSymmetricKey(this_01,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                            in_stack_fffffffffffffee0);
    if (CVar8 == 0) {
      (**(code **)(*plVar12 + 0x20))();
      sVar13 = ByteString::size((ByteString *)0x169f3a);
      (**(code **)(*plVar12 + 0x30))(plVar12,sVar13 * local_c8.currentBufferSize);
      inSymmetricCryptoOp = &local_c8;
      bVar1 = (**(code **)(*plVar6 + 0x28))
                        (plVar6,plVar12,uVar14,&local_c8.currentAEADBuffer,bVar1 & 1,local_c8._40_8_
                        );
      if ((bVar1 & 1) == 0) {
        (**(code **)(*plVar6 + 0x50))(plVar6,plVar12);
        pCVar11 = CryptoFactory::i();
        (*pCVar11->_vptr_CryptoFactory[1])(pCVar11,plVar6);
        local_8 = 0x70;
      }
      else {
        Session::setOpType(this_00,3);
        Session::setSymmetricCryptoOp(local_e0,inSymmetricCryptoOp);
        Session::setAllowMultiPartOp(this_00,true);
        Session::setAllowSinglePartOp(this_00,true);
        Session::setSymmetricKey(local_e0,(SymmetricKey *)inSymmetricCryptoOp);
        local_8 = 0;
      }
    }
    else {
      (**(code **)(*plVar6 + 0x50))(plVar6,plVar12);
      pCVar11 = CryptoFactory::i();
      (*pCVar11->_vptr_CryptoFactory[1])(pCVar11,plVar6);
      local_8 = 5;
    }
  }
LAB_0016a0a5:
  ByteString::~ByteString((ByteString *)0x16a0b2);
  ByteString::~ByteString((ByteString *)0x16a0bf);
  return local_8;
}

Assistant:

CK_RV SoftHSM::SymDecryptInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for decryption
	if (!key->getBooleanValue(CKA_DECRYPT, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;


	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get key info
	CK_KEY_TYPE keyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);

	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymMode::Type mode = SymMode::Unknown;
	bool padding = false;
	ByteString iv;
	size_t bb = 8;
	size_t counterBits = 0;
	ByteString aad;
	size_t tagBytes = 0;
	switch(pMechanism->mechanism) {
#ifndef WITH_FIPS
		case CKM_DES_ECB:
			if (keyType != CKK_DES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES;
			mode = SymMode::ECB;
			bb = 7;
			break;
		case CKM_DES_CBC:
			if (keyType != CKK_DES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES;
			mode = SymMode::CBC;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
		case CKM_DES_CBC_PAD:
			if (keyType != CKK_DES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES;
			mode = SymMode::CBC;
			padding = true;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
#endif
		case CKM_DES3_ECB:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES3;
			mode = SymMode::ECB;
			bb = 7;
			break;
		case CKM_DES3_CBC:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES3;
			mode = SymMode::CBC;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
		case CKM_DES3_CBC_PAD:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::DES3;
			mode = SymMode::CBC;
			padding = true;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			bb = 7;
			break;
		case CKM_AES_ECB:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::ECB;
			break;
		case CKM_AES_CBC:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::CBC;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			break;
		case CKM_AES_CBC_PAD:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::CBC;
			padding = true;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen == 0)
			{
				DEBUG_MSG("CBC mode requires an init vector");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(pMechanism->ulParameterLen);
			memcpy(&iv[0], pMechanism->pParameter, pMechanism->ulParameterLen);
			break;
		case CKM_AES_CTR:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::CTR;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_AES_CTR_PARAMS))
			{
				DEBUG_MSG("CTR mode requires a counter block");
				return CKR_ARGUMENTS_BAD;
			}
			counterBits = CK_AES_CTR_PARAMS_PTR(pMechanism->pParameter)->ulCounterBits;
			if (counterBits == 0 || counterBits > 128)
			{
				DEBUG_MSG("Invalid ulCounterBits");
				return CKR_MECHANISM_PARAM_INVALID;
			}
			iv.resize(16);
			memcpy(&iv[0], CK_AES_CTR_PARAMS_PTR(pMechanism->pParameter)->cb, 16);
			break;
		case CKM_AES_GCM:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = SymAlgo::AES;
			mode = SymMode::GCM;
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_GCM_PARAMS))
			{
				DEBUG_MSG("GCM mode requires parameters");
				return CKR_ARGUMENTS_BAD;
			}
			iv.resize(CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulIvLen);
			memcpy(&iv[0], CK_GCM_PARAMS_PTR(pMechanism->pParameter)->pIv, CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulIvLen);
			aad.resize(CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulAADLen);
			if (CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulAADLen > 0)
				memcpy(&aad[0], CK_GCM_PARAMS_PTR(pMechanism->pParameter)->pAAD, CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulAADLen);
			tagBytes = CK_GCM_PARAMS_PTR(pMechanism->pParameter)->ulTagBits;
			if (tagBytes > 128 || tagBytes % 8 != 0)
			{
				DEBUG_MSG("Invalid ulTagBits value");
				return CKR_ARGUMENTS_BAD;
			}
			tagBytes = tagBytes / 8;
			break;
		default:
			return CKR_MECHANISM_INVALID;
	}
	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* secretkey = new SymmetricKey();

	if (getSymmetricKey(secretkey, token, key) != CKR_OK)
	{
		cipher->recycleKey(secretkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	secretkey->setBitLen(secretkey->getKeyBits().size() * bb);

	// Initialize decryption
	if (!cipher->decryptInit(secretkey, mode, iv, padding, counterBits, aad, tagBytes))
	{
		cipher->recycleKey(secretkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_MECHANISM_INVALID;
	}

	session->setOpType(SESSION_OP_DECRYPT);
	session->setSymmetricCryptoOp(cipher);
	session->setAllowMultiPartOp(true);
	session->setAllowSinglePartOp(true);
	session->setSymmetricKey(secretkey);

	return CKR_OK;
}